

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O1

void __thiscall
SDL2pp::Surface::BlitScaled
          (Surface *this,Optional<Rect> *srcrect,Surface *dst,Optional<Rect> *dstrect)

{
  int iVar1;
  Optional<Rect> *pOVar2;
  Exception *this_00;
  undefined8 *puVar3;
  SDL_Rect tmpdstrect;
  undefined8 local_28;
  undefined8 uStack_20;
  
  puVar3 = &local_28;
  if ((dstrect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == true) {
    local_28 = *(undefined8 *)&(dstrect->super___optional_storage<SDL2pp::Rect,_true>).field_0;
    uStack_20 = *(undefined8 *)
                 ((long)&(dstrect->super___optional_storage<SDL2pp::Rect,_true>).field_0 + 8);
  }
  else {
    puVar3 = (undefined8 *)0x0;
  }
  pOVar2 = (Optional<Rect> *)0x0;
  if ((srcrect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ != false) {
    pOVar2 = srcrect;
  }
  iVar1 = SDL_UpperBlitScaled(this->surface_,pOVar2,dst->surface_,puVar3);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x50);
  Exception::Exception(this_00,"SDL_BlitScaled");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Surface::BlitScaled(const Optional<Rect>& srcrect, Surface& dst, const Optional<Rect>& dstrect) {
	SDL_Rect tmpdstrect; // 4th argument is non-const; does it modify rect?
	if (dstrect)
		tmpdstrect = *dstrect;
	if (SDL_BlitScaled(surface_, srcrect ? &*srcrect : nullptr, dst.Get(), dstrect ? &tmpdstrect : nullptr) != 0)
		throw Exception("SDL_BlitScaled");
}